

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::AddString
          (TextFormatDecodeData *this,int32 key,string *input_for_decode,string *desired_output)

{
  int *piVar1;
  ostream *poVar2;
  pointer ppVar3;
  string local_70;
  undefined1 local_50 [40];
  
  ppVar3 = (this->entries_).
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar3 == (this->entries_).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      DecodeDataForString(&local_70,input_for_decode,desired_output);
      local_50._0_4_ = key;
      std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_70);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)this,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_50);
      std::__cxx11::string::~string((string *)(local_50 + 8));
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    piVar1 = &ppVar3->first;
    ppVar3 = ppVar3 + 1;
  } while (*piVar1 != key);
  poVar2 = std::operator<<((ostream *)&std::cerr,"error: duplicate key (");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,key);
  poVar2 = std::operator<<(poVar2,") making TextFormat data, input: \"");
  poVar2 = std::operator<<(poVar2,(string *)input_for_decode);
  poVar2 = std::operator<<(poVar2,"\", desired: \"");
  poVar2 = std::operator<<(poVar2,(string *)desired_output);
  poVar2 = std::operator<<(poVar2,"\".");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  abort();
}

Assistant:

void TextFormatDecodeData::AddString(int32 key,
                                     const string& input_for_decode,
                                     const string& desired_output) {
  for (vector<DataEntry>::const_iterator i = entries_.begin();
       i != entries_.end(); ++i) {
    if (i->first == key) {
      cerr << "error: duplicate key (" << key
           << ") making TextFormat data, input: \"" << input_for_decode
           << "\", desired: \"" << desired_output << "\"." << endl;
      cerr.flush();
      abort();
    }
  }

  const string& data = TextFormatDecodeData::DecodeDataForString(
      input_for_decode, desired_output);
  entries_.push_back(DataEntry(key, data));
}